

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void initValue(Storage3D *ref,ElementType val,int64_t domain_size,int64_t domain_heigh)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined8 *puVar12;
  long lVar13;
  
  iVar4 = halo_width;
  lVar5 = -halo_width;
  lVar7 = domain_size + halo_width;
  if (lVar7 != lVar5 && SBORROW8(lVar7,lVar5) == lVar7 + halo_width < 0) {
    lVar1 = domain_height + halo_width * 2;
    lVar6 = domain_height + halo_width;
    lVar8 = halo_width * -8;
    lVar9 = lVar5;
    do {
      lVar2 = (ref->strides)._M_elems[1];
      lVar3 = (ref->strides)._M_elems[0];
      puVar12 = (undefined8 *)
                (-(lVar3 * 8 + lVar2 * 8) * iVar4 + (ref->strides)._M_elems[2] * lVar8 +
                 ref->offset * 8 + (long)ref->alignedPtr);
      lVar13 = lVar5;
      do {
        puVar10 = puVar12;
        lVar11 = lVar1;
        if (lVar6 != lVar5 && SBORROW8(lVar6,lVar5) == lVar6 + iVar4 < 0) {
          do {
            *puVar10 = 0;
            puVar10 = puVar10 + lVar3;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        lVar13 = lVar13 + 1;
        puVar12 = puVar12 + lVar2;
      } while (lVar13 != lVar7);
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 8;
    } while (lVar9 != lVar7);
  }
  return;
}

Assistant:

void initValue(Storage3D &ref, const ElementType val, const int64_t domain_size, const int64_t domain_heigh) {
  for (int64_t i = -halo_width; i < domain_size + halo_width; ++i)
    for (int64_t j = -halo_width; j < domain_size + halo_width; ++j)
      for (int64_t k = -halo_width; k < domain_height + halo_width; ++k) {
        ref(i, j, k) = val;
      }
}